

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O3

uchar * rans_uncompress_O1(uchar *in,uint in_size,uint *out_size)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint8_t *ptr;
  uchar *puVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint *puVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  bool bVar31;
  RansDecSymbol syms [256] [256];
  ari_decoder D [256];
  ushort auStack_c0838 [131072];
  uint auStack_80838 [512];
  long alStack_80038 [65537];
  
  memset(auStack_80838,0,0x80800);
  if ((*in == '\x01') && (*(int *)(in + 1) == in_size - 9)) {
    uVar6 = *(uint *)(in + 5);
    puVar7 = (uchar *)malloc((long)(int)uVar6);
    uVar12 = 0;
    if (puVar7 != (uchar *)0x0) {
      uVar17 = (uint)in[9];
      puVar24 = (uint *)(in + 10);
      do {
        uVar28 = (uint)(byte)*puVar24;
        puVar24 = (uint *)((long)puVar24 + 1);
        lVar8 = (long)(int)uVar17;
        uVar27 = 0;
        uVar16 = 0;
        do {
          bVar2 = (byte)*puVar24;
          uVar18 = (uint)bVar2;
          lVar9 = (long)(int)uVar28;
          if ((char)bVar2 < '\0') {
            auStack_80838[lVar8 * 0x202 + lVar9 * 2] = bVar2 & 0x7f;
            pbVar1 = (byte *)((long)puVar24 + 1);
            puVar24 = (uint *)((long)puVar24 + 2);
            uVar18 = (bVar2 & 0x7f) << 8 | (uint)*pbVar1;
          }
          else {
            puVar24 = (uint *)((long)puVar24 + 1);
          }
          uVar30 = (uint)uVar16;
          auStack_80838[lVar8 * 0x202 + lVar9 * 2 + 1] = uVar30;
          if (uVar18 == 0) {
            uVar18 = 0x1000;
          }
          auStack_80838[lVar8 * 0x202 + lVar9 * 2] = uVar18;
          if (0x10000 - uVar30 < uVar18) {
            __assert_fail("freq <= (1 << 16) - start",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                          ,0x104,"void RansDecSymbolInit(RansDecSymbol *, uint32_t, uint32_t)");
          }
          auStack_c0838[lVar8 * 0x200 + lVar9 * 2] = (ushort)uVar16;
          auStack_c0838[lVar8 * 0x200 + lVar9 * 2 + 1] = (ushort)uVar18;
          pvVar10 = (void *)alStack_80038[lVar8 * 0x101];
          if (pvVar10 == (void *)0x0) {
            pvVar10 = malloc(0x1000);
            alStack_80038[lVar8 * 0x101] = (long)pvVar10;
          }
          memset((void *)(uVar16 + (long)pvVar10),uVar28,(ulong)uVar18);
          uVar16 = (ulong)(uVar18 + uVar30);
          if (0x1000 < uVar18 + uVar30) {
            __assert_fail("x <= TOTFREQ",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                          ,0x25c,
                          "unsigned char *rans_uncompress_O1(unsigned char *, unsigned int, unsigned int *)"
                         );
          }
          if (uVar27 == 0) {
            uVar18 = *puVar24;
            if (uVar28 + 1 == (uint)(byte)uVar18) {
              uVar27 = (uint)*(byte *)((long)puVar24 + 1);
              puVar24 = (uint *)((long)puVar24 + 2);
              goto LAB_00136b3b;
            }
            puVar24 = (uint *)((long)puVar24 + 1);
            uVar27 = 0;
            uVar28 = (uint)(byte)uVar18;
          }
          else {
            uVar27 = uVar27 - 1;
LAB_00136b3b:
            uVar28 = uVar28 + 1;
          }
        } while (uVar28 != 0);
        if (uVar12 == 0) {
          uVar28 = uVar17 + 1;
          uVar17 = (uint)(byte)*puVar24;
          if (uVar28 == uVar17) {
            uVar12 = (uint)*(byte *)((long)puVar24 + 1);
            puVar24 = (uint *)((long)puVar24 + 2);
            uVar17 = uVar28;
          }
          else {
            puVar24 = (uint *)((long)puVar24 + 1);
            uVar12 = 0;
          }
        }
        else {
          uVar12 = uVar12 - 1;
          uVar17 = uVar17 + 1;
        }
        if (uVar17 == 0) {
          uVar12 = puVar24[3];
          puVar11 = puVar24 + 4;
          uVar17 = (int)uVar6 >> 2;
          uVar16 = (ulong)(uVar17 * 3);
          if ((int)uVar17 < 1) {
            uVar26 = 0;
          }
          else {
            uVar28 = puVar24[2];
            uVar27 = *puVar24;
            uVar18 = puVar24[1];
            uVar19 = (ulong)(uVar17 * 2);
            uVar16 = (ulong)(uVar17 * 3);
            uVar29 = 0;
            uVar13 = 0;
            uVar14 = 0;
            uVar20 = 0;
            uVar23 = (ulong)uVar17;
            uVar25 = 0;
            do {
              bVar2 = *(byte *)(alStack_80038[uVar14 * 0x101] + (ulong)(uVar27 & 0xfff));
              uVar22 = (ulong)bVar2;
              bVar3 = *(byte *)(alStack_80038[uVar20 * 0x101] + (ulong)(uVar18 & 0xfff));
              uVar21 = (ulong)bVar3;
              bVar4 = *(byte *)(alStack_80038[uVar13 * 0x101] + (ulong)(uVar28 & 0xfff));
              uVar15 = (ulong)bVar4;
              uVar27 = ((uVar27 & 0xfff) - (uint)auStack_c0838[uVar14 * 0x200 + uVar22 * 2]) +
                       (uVar27 >> 0xc) * (uint)auStack_c0838[uVar14 * 0x200 + uVar22 * 2 + 1];
              bVar5 = *(byte *)(alStack_80038[uVar25 * 0x101] + (ulong)(uVar12 & 0xfff));
              uVar26 = (ulong)bVar5;
              puVar7[uVar29] = bVar2;
              puVar7[uVar23] = bVar3;
              puVar7[uVar19] = bVar4;
              puVar7[uVar16] = bVar5;
              uVar30 = uVar27;
              if (uVar27 < 0x800000) {
                do {
                  uVar27 = *puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar27 = (uint)(byte)uVar27 | uVar30 << 8;
                  bVar31 = uVar30 < 0x8000;
                  uVar30 = uVar27;
                } while (bVar31);
              }
              uVar18 = ((uVar18 & 0xfff) - (uint)auStack_c0838[uVar20 * 0x200 + uVar21 * 2]) +
                       (uVar18 >> 0xc) * (uint)auStack_c0838[uVar20 * 0x200 + uVar21 * 2 + 1];
              uVar30 = uVar18;
              if (uVar18 < 0x800000) {
                do {
                  uVar18 = *puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar18 = (uint)(byte)uVar18 | uVar30 << 8;
                  bVar31 = uVar30 < 0x8000;
                  uVar30 = uVar18;
                } while (bVar31);
              }
              uVar28 = ((uVar28 & 0xfff) - (uint)auStack_c0838[uVar13 * 0x200 + uVar15 * 2]) +
                       (uVar28 >> 0xc) * (uint)auStack_c0838[uVar13 * 0x200 + uVar15 * 2 + 1];
              uVar30 = uVar28;
              if (uVar28 < 0x800000) {
                do {
                  uVar28 = *puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar28 = (uint)(byte)uVar28 | uVar30 << 8;
                  bVar31 = uVar30 < 0x8000;
                  uVar30 = uVar28;
                } while (bVar31);
              }
              uVar12 = ((uVar12 & 0xfff) - (uint)auStack_c0838[uVar25 * 0x200 + uVar26 * 2]) +
                       (uVar12 >> 0xc) * (uint)auStack_c0838[uVar25 * 0x200 + uVar26 * 2 + 1];
              uVar30 = uVar12;
              if (uVar12 < 0x800000) {
                do {
                  uVar12 = *puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar12 = (uint)(byte)uVar12 | uVar30 << 8;
                  bVar31 = uVar30 < 0x8000;
                  uVar30 = uVar12;
                } while (bVar31);
              }
              uVar29 = uVar29 + 1;
              uVar23 = uVar23 + 1;
              uVar19 = uVar19 + 1;
              uVar16 = uVar16 + 1;
              uVar13 = uVar15;
              uVar14 = uVar22;
              uVar20 = uVar21;
              uVar25 = uVar26;
            } while (uVar29 != uVar17);
          }
          if ((int)uVar16 < (int)uVar6) {
            lVar8 = (long)(int)uVar16;
            do {
              bVar2 = *(byte *)(alStack_80038[uVar26 * 0x101] + (ulong)(uVar12 & 0xfff));
              uVar16 = (ulong)bVar2;
              puVar7[lVar8] = bVar2;
              uVar12 = ((uVar12 & 0xfff) - (uint)auStack_c0838[uVar26 * 0x200 + uVar16 * 2]) +
                       (uVar12 >> 0xc) * (uint)auStack_c0838[uVar26 * 0x200 + uVar16 * 2 + 1];
              uVar17 = uVar12;
              if (uVar12 < 0x800000) {
                do {
                  uVar12 = *puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar12 = (uint)(byte)uVar12 | uVar17 << 8;
                  bVar31 = uVar17 < 0x8000;
                  uVar17 = uVar12;
                } while (bVar31);
              }
              lVar8 = lVar8 + 1;
              uVar26 = uVar16;
            } while (lVar8 < (int)uVar6);
          }
          *out_size = uVar6;
          lVar8 = 0x800;
          do {
            if (*(void **)((long)auStack_80838 + lVar8) != (void *)0x0) {
              free(*(void **)((long)auStack_80838 + lVar8));
            }
            lVar8 = lVar8 + 0x808;
          } while (lVar8 != 0x81000);
          return puVar7;
        }
      } while( true );
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *rans_uncompress_O1(unsigned char *in, unsigned int in_size,
				  unsigned int *out_size) {
    /* Load in the static tables */
    unsigned char *cp = in + 9;
    int i, j = -999, x, out_sz, in_sz, rle_i, rle_j;
    char *out_buf;
    ari_decoder D[256];
    RansDecSymbol syms[256][256];

    memset(D, 0, 256*sizeof(*D));

    if (*in++ != 1) // Order-1 check
	return NULL;

    in_sz  = ((in[0])<<0) | ((in[1])<<8) | ((in[2])<<16) | ((in[3])<<24);
    out_sz = ((in[4])<<0) | ((in[5])<<8) | ((in[6])<<16) | ((in[7])<<24);
    if (in_sz != in_size-9)
	return NULL;

    out_buf = malloc(out_sz);
    if (!out_buf)
	return NULL;

    //fprintf(stderr, "out_sz=%d\n", out_sz);

    //i = *cp++;
    rle_i = 0;
    i = *cp++;
    do {
	rle_j = x = 0;
	j = *cp++;
	do {
	    if ((D[i].fc[j].F = *cp++) >= 128) {
		D[i].fc[j].F &= ~128;
		D[i].fc[j].F = ((D[i].fc[j].F & 127) << 8) | *cp++;
	    }
	    D[i].fc[j].C = x;

	    //fprintf(stderr, "i=%d j=%d F=%d C=%d\n", i, j, D[i].fc[j].F, D[i].fc[j].C);

	    if (!D[i].fc[j].F)
		D[i].fc[j].F = TOTFREQ;

	    RansDecSymbolInit(&syms[i][j], D[i].fc[j].C, D[i].fc[j].F);

	    /* Build reverse lookup table */
	    if (!D[i].R) D[i].R = (unsigned char *)malloc(TOTFREQ);
	    memset(&D[i].R[x], j, D[i].fc[j].F);

	    x += D[i].fc[j].F;
	    assert(x <= TOTFREQ);

	    if (!rle_j && j+1 == *cp) {
		j = *cp++;
		rle_j = *cp++;
	    } else if (rle_j) {
		rle_j--;
		j++;
	    } else {
		j = *cp++;
	    }
	} while(j);

	if (!rle_i && i+1 == *cp) {
	    i = *cp++;
	    rle_i = *cp++;
	} else if (rle_i) {
	    rle_i--;
	    i++;
	} else {
	    i = *cp++;
	}
    } while (i);

    // Precompute reverse lookup of frequency.

    RansState rans0, rans1, rans2, rans3;
    uint8_t *ptr = cp;
    RansDecInit(&rans0, &ptr);
    RansDecInit(&rans1, &ptr);
    RansDecInit(&rans2, &ptr);
    RansDecInit(&rans3, &ptr);

    int isz4 = out_sz>>2;
    int l0 = 0;
    int l1 = 0;
    int l2 = 0;
    int l3 = 0;
    int i4[] = {0*isz4, 1*isz4, 2*isz4, 3*isz4};

    RansState R[4];
    R[0] = rans0;
    R[1] = rans1;
    R[2] = rans2;
    R[3] = rans3;

    for (; i4[0] < isz4; i4[0]++, i4[1]++, i4[2]++, i4[3]++) {
	uint32_t m[4] = {R[0] & ((1u << TF_SHIFT)-1),
			 R[1] & ((1u << TF_SHIFT)-1),
			 R[2] & ((1u << TF_SHIFT)-1),
			 R[3] & ((1u << TF_SHIFT)-1)};

	uint8_t c[4] = {D[l0].R[m[0]],
			D[l1].R[m[1]],
			D[l2].R[m[2]],
			D[l3].R[m[3]]};

	out_buf[i4[0]] = c[0];
	out_buf[i4[1]] = c[1];
	out_buf[i4[2]] = c[2];
	out_buf[i4[3]] = c[3];

	//RansDecAdvanceSymbolStep(&R[0], &syms[l0][c[0]], TF_SHIFT);
	//RansDecAdvanceSymbolStep(&R[1], &syms[l1][c[1]], TF_SHIFT);
	//RansDecAdvanceSymbolStep(&R[2], &syms[l2][c[2]], TF_SHIFT);
	//RansDecAdvanceSymbolStep(&R[3], &syms[l3][c[3]], TF_SHIFT);

	R[0] = syms[l0][c[0]].freq * (R[0]>>TF_SHIFT);
	R[1] = syms[l1][c[1]].freq * (R[1]>>TF_SHIFT);
	R[2] = syms[l2][c[2]].freq * (R[2]>>TF_SHIFT);
	R[3] = syms[l3][c[3]].freq * (R[3]>>TF_SHIFT);

	R[0] += m[0] - syms[l0][c[0]].start;
	R[1] += m[1] - syms[l1][c[1]].start;
	R[2] += m[2] - syms[l2][c[2]].start;
	R[3] += m[3] - syms[l3][c[3]].start;

	RansDecRenorm(&R[0], &ptr);
	RansDecRenorm(&R[1], &ptr);
	RansDecRenorm(&R[2], &ptr);
	RansDecRenorm(&R[3], &ptr);

	l0 = c[0];
	l1 = c[1];
	l2 = c[2];
	l3 = c[3];
    }

    rans0 = R[0];
    rans1 = R[1];
    rans2 = R[2];
    rans3 = R[3];

    // Remainder
    for (; i4[3] < out_sz; i4[3]++) {
	unsigned char c3 = D[l3].R[RansDecGet(&rans3, TF_SHIFT)];
	out_buf[i4[3]] = c3;
	RansDecAdvanceSymbol(&rans3, &ptr, &syms[l3][c3], TF_SHIFT);
	l3 = c3;
    }

    *out_size = out_sz;

    for (i = 0; i < 256; i++)
	if (D[i].R) free(D[i].R);

    return (unsigned char *)out_buf;
}